

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O3

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int *piVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  XmlOutput *pXVar5;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  xml_output local_148;
  xml_output local_110;
  xml_output local_d8;
  xml_output local_a0;
  xml_output local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x48) != 0) {
    local_68.xo_type = tTag;
    local_68.xo_text.d.d = *__buf;
    local_68.xo_text.d.ptr = *(char16_t **)((long)__buf + 8);
    local_68.xo_text.d.size = *(qsizetype *)((long)__buf + 0x10);
    if (&(local_68.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_68.xo_value.d.d = (Data *)0x0;
    local_68.xo_value.d.ptr = (char16_t *)0x0;
    local_68.xo_value.d.size = 0;
    pXVar5 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_68);
    if (*(long *)((long)__buf + 0x28) == 0) {
      local_a0.xo_type = tNothing;
      local_a0.xo_text.d.d = (Data *)0x0;
      local_a0.xo_text.d.ptr = (char16_t *)0x0;
      local_a0.xo_text.d.size = 0;
      local_a0.xo_value.d.d = (Data *)0x0;
      local_a0.xo_value.d.ptr = (char16_t *)0x0;
      local_a0.xo_value.d.size = 0;
    }
    else {
      QVar6.m_data = (storage_type *)0xf;
      QVar6.m_size = (qsizetype)&local_a0;
      QString::fromUtf8(QVar6);
      local_a0.xo_text.d.size = (qsizetype)local_a0.xo_text.d.ptr;
      pQVar3 = (QArrayData *)CONCAT44(local_a0._4_4_,local_a0.xo_type);
      local_a0.xo_type = tAttribute;
      local_a0.xo_text.d.ptr = (char16_t *)local_a0.xo_text.d.d;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_a0.xo_value.d.d = *(Data **)((long)__buf + 0x18);
      local_a0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x20);
      local_a0.xo_value.d.size = *(qsizetype *)((long)__buf + 0x28);
      if (&(local_a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + 1;
        UNLOCK();
      }
      local_a0.xo_text.d.d = (Data *)pQVar3;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
    }
    pXVar5 = XmlOutput::operator<<(pXVar5,&local_a0);
    iVar1 = *(int *)((long)__buf + 0x30);
    QVar7.m_data = (storage_type *)0xe;
    QVar7.m_size = (qsizetype)&local_d8;
    QString::fromUtf8(QVar7);
    pcVar4 = local_d8.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_d8._4_4_,local_d8.xo_type);
    QString::number((int)&local_110,iVar1);
    local_d8.xo_type = tAttribute;
    local_d8.xo_text.d.ptr = (char16_t *)local_d8.xo_text.d.d;
    local_d8.xo_text.d.size = (qsizetype)pcVar4;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_d8.xo_value.d.d = (Data *)CONCAT44(local_110._4_4_,local_110.xo_type);
    local_d8.xo_value.d.ptr = (char16_t *)local_110.xo_text.d.d;
    local_d8.xo_value.d.size = (qsizetype)local_110.xo_text.d.ptr;
    local_d8.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_d8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      piVar2 = (int *)CONCAT44(local_110._4_4_,local_110.xo_type);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_110._4_4_,local_110.xo_type),2,0x10);
        }
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    pXVar5 = XmlOutput::operator<<(pXVar5,&local_d8);
    if (*(long *)((long)__buf + 0x48) == 0) {
      local_110.xo_type = tNothing;
      local_110.xo_text.d.d = (Data *)0x0;
      local_110.xo_text.d.ptr = (char16_t *)0x0;
      local_110.xo_text.d.size = 0;
      local_110.xo_value.d.d = (Data *)0x0;
      local_110.xo_value.d.ptr = (char16_t *)0x0;
      local_110.xo_value.d.size = 0;
    }
    else {
      QVar8.m_data = (storage_type *)0xf;
      QVar8.m_size = (qsizetype)&local_110;
      QString::fromUtf8(QVar8);
      local_110.xo_text.d.size = (qsizetype)local_110.xo_text.d.ptr;
      pQVar3 = (QArrayData *)CONCAT44(local_110._4_4_,local_110.xo_type);
      local_110.xo_type = tAttribute;
      local_110.xo_text.d.ptr = (char16_t *)local_110.xo_text.d.d;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_110.xo_value.d.d = *(Data **)((long)__buf + 0x38);
      local_110.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x40);
      local_110.xo_value.d.size = *(qsizetype *)((long)__buf + 0x48);
      if (&(local_110.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_110.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_110.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + 1;
        UNLOCK();
      }
      local_110.xo_text.d.d = (Data *)pQVar3;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
    }
    pXVar5 = XmlOutput::operator<<(pXVar5,&local_110);
    local_148.xo_type = tCloseTag;
    local_148.xo_text.d.d = *__buf;
    local_148.xo_text.d.ptr = *(char16_t **)((long)__buf + 8);
    local_148.xo_text.d.size = *(qsizetype *)((long)__buf + 0x10);
    if (&(local_148.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_148.xo_value.d.d = (Data *)0x0;
    local_148.xo_value.d.ptr = (char16_t *)0x0;
    local_148.xo_value.d.size = 0;
    XmlOutput::operator<<(pXVar5,&local_148);
    if (&(local_148.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_148.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_148.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_148.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_148.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_148.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_110.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_110.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_110.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_110.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_110.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_110.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_110.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_110.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_110.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_110.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_d8.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_d8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_a0.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_a0.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.xo_value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCDeploymentTool &tool)
{
    if (tool.AdditionalFiles.isEmpty())
        return;
    xml << tag(tool.DeploymentTag)
        << attrS(_RemoteDirectory, tool.RemoteDirectory)
        << attrE(_RegisterOutput, tool.RegisterOutput)
        << attrS(_AdditionalFiles, tool.AdditionalFiles)
        << closetag(tool.DeploymentTag);
}